

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_backend.cpp
# Opt level: O1

void __thiscall basisu::basisu_backend::create_encoder_blocks(basisu_backend *this)

{
  vector<basisu::vector2D<basisu::encoder_block>_> *this_00;
  vector2D<basisu::encoder_block> *pvVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  bool bVar4;
  basis_texture_type bVar5;
  uint32_t uVar6;
  basisu_frontend *pbVar7;
  vector2D<basisu::encoder_block> *pvVar8;
  void *__ptr;
  basisu_backend_slice_desc *pbVar9;
  vec2U *pvVar10;
  encoder_block *peVar11;
  pixel_block *ppVar12;
  endpoint_cluster_etc_params *peVar13;
  int iVar14;
  encoder_block *peVar15;
  uint32_t uVar16;
  int iVar17;
  uint uVar18;
  uint32_t uVar19;
  uint64_t uVar20;
  ulong uVar21;
  ulong uVar22;
  char cVar23;
  uint uVar24;
  ulong uVar25;
  char *pcVar26;
  uint uVar27;
  uint uVar28;
  int iVar29;
  long lVar30;
  uint uVar31;
  encoder_block *peVar32;
  int iVar33;
  int iVar34;
  uint uVar35;
  uint32_t new_size;
  uint uVar36;
  ulong uVar37;
  ulong uVar38;
  long lVar39;
  ulong uVar40;
  bool bVar41;
  float fVar42;
  undefined1 auVar43 [16];
  float fVar44;
  undefined1 auVar45 [16];
  uint_vec all_endpoint_indices;
  color_rgba pred_color;
  etc_block etc_blk;
  color_rgba trial_colors [16];
  interval_timer tm;
  uint local_134;
  uint local_130;
  float local_12c;
  uint local_10c;
  uint local_108;
  vector<unsigned_int> local_f8;
  ulong local_e0;
  uint32_t local_d4;
  int local_d0;
  uint local_cc;
  basisu_backend *local_c8;
  anon_union_8_2_04352b30_for_etc_block_0 local_c0;
  uint32_t local_b8;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_b4;
  ulong local_b0;
  anon_union_8_2_04352b30_for_etc_block_0 local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_88 [16];
  interval_timer local_48;
  
  debug_printf("basisu_backend::create_encoder_blocks\n");
  interval_timer::interval_timer(&local_48);
  interval_timer::start(&local_48);
  pbVar7 = this->m_pFront_end;
  bVar5 = (pbVar7->m_params).m_tex_type;
  this_00 = &this->m_slice_encoder_blocks;
  uVar28 = (this->m_slices).m_size;
  uVar36 = (this->m_slice_encoder_blocks).m_size;
  uVar24 = uVar36 - uVar28;
  if (uVar24 != 0) {
    if (uVar36 < uVar28 || uVar24 == 0) {
      if ((this->m_slice_encoder_blocks).m_capacity < uVar28) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)this_00,uVar28,uVar36 + 1 == uVar28,0x18,
                   vector<basisu::vector2D<basisu::encoder_block>_>::object_mover,false);
      }
      uVar36 = (this->m_slice_encoder_blocks).m_size;
      if (uVar28 != uVar36) {
        memset(this_00->m_p + uVar36,0,
               (((ulong)(uVar28 - uVar36) * 0x18 - 0x18) / 0x18) * 0x18 + 0x18);
      }
    }
    else {
      pvVar8 = this_00->m_p;
      lVar39 = 0;
      do {
        __ptr = *(void **)((long)&pvVar8[uVar28].m_values.m_p + lVar39);
        if (__ptr != (void *)0x0) {
          free(__ptr);
        }
        lVar39 = lVar39 + 0x18;
      } while ((ulong)uVar24 * 0x18 != lVar39);
    }
    (this->m_slice_encoder_blocks).m_size = uVar28;
  }
  local_f8.m_p = (uint *)0x0;
  local_f8.m_size = 0;
  local_f8.m_capacity = 0;
  uVar38 = 0;
  if ((this->m_slices).m_size != 0) {
    uVar28 = 0;
    do {
      uVar16 = get_total_blocks(this,(uint32_t)uVar38);
      uVar28 = uVar28 + uVar16;
      uVar36 = (uint32_t)uVar38 + 1;
      uVar38 = (ulong)uVar36;
    } while (uVar36 < (this->m_slices).m_size);
    uVar38 = (ulong)uVar28;
  }
  vector<unsigned_int>::reserve(&local_f8,uVar38);
  if ((this->m_slices).m_size == 0) {
    local_10c = 0;
    local_130 = 0;
    local_134 = 0;
  }
  else {
    uVar38 = 0;
    local_134 = 0;
    local_130 = 0;
    local_10c = 0;
    local_c8 = this;
    do {
      iVar17 = -1;
      if (bVar5 == cBASISTexTypeVideoFrames) {
        iVar17 = find_video_frame(this,(int)uVar38,-1);
      }
      if ((this->m_slices).m_size <= uVar38) {
        pcVar26 = 
        "T &basisu::vector<basisu::basisu_backend_slice_desc>::operator[](size_t) [T = basisu::basisu_backend_slice_desc]"
        ;
LAB_0020524d:
        __assert_fail("i < m_size",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                      ,0x178,pcVar26);
      }
      if ((this->m_slice_encoder_blocks).m_size <= uVar38) {
LAB_00205221:
        pcVar26 = 
        "T &basisu::vector<basisu::vector2D<basisu::encoder_block>>::operator[](size_t) [T = basisu::vector2D<basisu::encoder_block>]"
        ;
        goto LAB_0020524d;
      }
      pbVar9 = (this->m_slices).m_p;
      bVar4 = pbVar9[uVar38].m_iframe;
      local_d4 = pbVar9[uVar38].m_first_block_index;
      uVar28 = pbVar9[uVar38].m_num_blocks_x;
      uVar16 = pbVar9[uVar38].m_num_blocks_y;
      vector2D<basisu::encoder_block>::resize(this_00->m_p + uVar38,uVar28,uVar16);
      this = local_c8;
      local_e0 = uVar38;
      if (uVar16 != 0) {
        local_90 = (ulong)iVar17;
        uVar36 = 0;
        uVar19 = local_d4;
        do {
          local_b8 = uVar19;
          if ((ulong)uVar28 != 0) {
            local_98 = (ulong)(uVar36 * uVar28 + local_d4);
            uVar37 = 0;
            local_cc = uVar19;
            do {
              uVar24 = local_cc;
              if ((this->m_slice_encoder_blocks).m_size <= local_e0) goto LAB_00205221;
              pvVar8 = this_00->m_p;
              if ((pvVar8[uVar38].m_width <= uVar37) || (pvVar8[uVar38].m_height <= uVar36)) {
LAB_00205257:
                __assert_fail("x < m_width && y < m_height",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_enc.h"
                              ,0xd2a,
                              "T &basisu::vector2D<basisu::encoder_block>::operator()(uint32_t, uint32_t) [T = basisu::encoder_block]"
                             );
              }
              iVar14 = (int)uVar37;
              uVar27 = iVar14 + pvVar8[uVar38].m_width * uVar36;
              if (pvVar8[uVar38].m_values.m_size <= uVar27) {
LAB_00205238:
                pcVar26 = 
                "T &basisu::vector<basisu::encoder_block>::operator[](size_t) [T = basisu::encoder_block]"
                ;
                goto LAB_0020524d;
              }
              uVar18 = (int)local_98 + iVar14;
              if ((pbVar7->m_block_endpoint_clusters_indices).m_size <= uVar18) {
LAB_00205276:
                pcVar26 = 
                "const T &basisu::vector<basisu::vec2U>::operator[](size_t) const [T = basisu::vec2U]"
                ;
LAB_00205330:
                __assert_fail("i < m_size",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                              ,0x177,pcVar26);
              }
              peVar32 = pvVar8[uVar38].m_values.m_p + uVar27;
              uVar6 = (pbVar7->m_block_endpoint_clusters_indices).m_p[uVar18].m_comps[0];
              peVar32->m_endpoint_index = uVar6;
              if ((pbVar7->m_block_endpoint_clusters_indices).m_size <= uVar18) goto LAB_00205276;
              pvVar10 = (pbVar7->m_block_endpoint_clusters_indices).m_p;
              if (pvVar10[uVar18].m_comps[0] != pvVar10[uVar18].m_comps[1]) {
                create_encoder_blocks();
LAB_002052af:
                __assert_fail("!m_p || (&obj < m_p) || (&obj >= (m_p + m_size))",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                              ,0x267,
                              "void basisu::vector<unsigned int>::push_back(const T &) [T = unsigned int]"
                             );
              }
              if ((pbVar7->m_block_selector_cluster_index).m_size <= uVar18) {
                pcVar26 = 
                "const T &basisu::vector<unsigned int>::operator[](size_t) const [T = unsigned int]"
                ;
                goto LAB_00205330;
              }
              peVar32->m_selector_index = (pbVar7->m_block_selector_cluster_index).m_p[uVar18];
              peVar32->m_endpoint_predictor = 3;
              uVar27 = 0xffffffff;
              lVar39 = 0;
              do {
                if (lVar39 == 2 && bVar5 == cBASISTexTypeVideoFrames) {
                  if (iVar17 != -1 && (bVar4 & 1U) == 0) {
                    uVar21 = (ulong)(this->m_slice_encoder_blocks).m_size;
                    if (uVar21 <= local_e0) goto LAB_00205221;
                    pvVar8 = this_00->m_p;
                    if ((pvVar8[uVar38].m_width <= uVar37) || (pvVar8[uVar38].m_height <= uVar36))
                    goto LAB_00205257;
                    uVar31 = pvVar8[uVar38].m_width * uVar36 + iVar14;
                    if (pvVar8[uVar38].m_values.m_size <= uVar31) goto LAB_00205238;
                    if (uVar21 <= local_90) goto LAB_00205221;
                    if ((pvVar8[local_90].m_width <= uVar37) ||
                       (pvVar8[local_90].m_height <= uVar36)) goto LAB_00205257;
                    pvVar1 = pvVar8 + local_90;
                    uVar35 = pvVar8[local_90].m_width * uVar36 + iVar14;
                    if ((pvVar1->m_values).m_size <= uVar35) goto LAB_00205238;
                    peVar11 = pvVar8[uVar38].m_values.m_p + uVar31;
                    uVar21._0_4_ = peVar11->m_endpoint_index;
                    uVar21._4_4_ = peVar11->m_selector_index;
                    auVar43._8_8_ = 0;
                    auVar43._0_8_ = uVar21;
                    peVar11 = (pvVar1->m_values).m_p;
                    peVar15 = peVar11 + uVar35;
                    uVar2 = peVar15->m_endpoint_index;
                    uVar3 = peVar15->m_selector_index;
                    auVar45._0_4_ = -(uint)(uVar2 == (undefined4)uVar21);
                    auVar45._4_4_ = -(uint)(uVar3 == uVar21._4_4_);
                    auVar45._8_4_ = 0xffffffff;
                    auVar45._12_4_ = 0xffffffff;
                    auVar43 = pmovsxdq(auVar43,auVar45);
                    iVar34 = movmskpd((int)pvVar1,auVar43);
                    if (iVar34 == 3) {
                      peVar11[uVar35].m_is_cr_target = true;
                      uVar27 = 2;
                    }
                  }
                }
                else {
                  uVar31 = *(char *)((long)&g_endpoint_preds + lVar39 * 2) + iVar14;
                  if ((((-1 < (int)uVar31) && ((int)uVar31 < (int)uVar28)) &&
                      (uVar35 = (int)*(char *)((long)&g_endpoint_preds + lVar39 * 2 + 1) + uVar36,
                      -1 < (int)uVar35)) && ((int)uVar35 < (int)uVar16)) {
                    if ((this->m_slice_encoder_blocks).m_size <= local_e0) goto LAB_00205221;
                    pvVar8 = this_00->m_p;
                    if ((pvVar8[uVar38].m_width <= uVar31) || (pvVar8[uVar38].m_height <= uVar35))
                    goto LAB_00205257;
                    uVar31 = pvVar8[uVar38].m_width * uVar35 + uVar31;
                    if (pvVar8[uVar38].m_values.m_size <= uVar31) goto LAB_00205238;
                    uVar35 = uVar27;
                    if ((uint)lVar39 < uVar27) {
                      uVar35 = (uint)lVar39;
                    }
                    if (pvVar8[uVar38].m_values.m_p[uVar31].m_endpoint_index == uVar6) {
                      uVar27 = uVar35;
                    }
                  }
                }
                lVar39 = lVar39 + 1;
              } while (lVar39 != 3);
              if (uVar27 == 0xffffffff) {
                if ((this->m_params).m_endpoint_rdo_quality_thresh <= 0.0) {
                  local_134 = local_134 + 1;
                }
                else {
                  if ((pbVar7->m_source_blocks).m_size <= uVar18) {
                    pcVar26 = 
                    "const T &basisu::vector<basisu::pixel_block>::operator[](size_t) const [T = basisu::pixel_block]"
                    ;
                    goto LAB_00205330;
                  }
                  if ((pbVar7->m_encoded_blocks).m_size <= uVar18) {
                    pcVar26 = 
                    "const T &basisu::vector<basisu::etc_block>::operator[](size_t) const [T = basisu::etc_block]"
                    ;
                    goto LAB_00205330;
                  }
                  ppVar12 = (pbVar7->m_source_blocks).m_p;
                  local_a8 = (anon_union_8_2_04352b30_for_etc_block_0)
                             (pbVar7->m_encoded_blocks).m_p[uVar18].field_0.m_uint64;
                  uVar20 = etc_block::evaluate_etc1_error
                                     ((etc_block *)&local_a8,(color_rgba *)(ppVar12 + uVar18),
                                      (pbVar7->m_params).m_perceptual,-1);
                  if (uVar20 != 0) {
                    fVar42 = (this->m_params).m_endpoint_rdo_quality_thresh;
                    fVar44 = 1.0;
                    if (1.0 <= fVar42) {
                      fVar44 = fVar42;
                    }
                    uVar21 = (ulong)(fVar44 * (float)uVar20);
                    uVar21 = (long)(fVar44 * (float)uVar20 - 9.223372e+18) & (long)uVar21 >> 0x3f |
                             uVar21;
                    local_c0 = local_a8;
                    local_108 = 0xffffffff;
                    local_b0 = 0xffffffffffffffff;
                    uVar40 = 0;
                    local_d0 = 0;
                    do {
                      if ((((bVar5 != cBASISTexTypeVideoFrames || uVar40 != 2) &&
                           (uVar27 = *(char *)((long)&g_endpoint_preds + uVar40 * 2) + iVar14,
                           -1 < (int)uVar27)) && ((int)uVar27 < (int)uVar28)) &&
                         ((uVar18 = (int)*(char *)((long)&g_endpoint_preds + uVar40 * 2 + 1) +
                                    uVar36, -1 < (int)uVar18 && ((int)uVar18 < (int)uVar16)))) {
                        if ((this->m_slice_encoder_blocks).m_size <= local_e0) goto LAB_00205221;
                        pvVar8 = this_00->m_p;
                        if ((pvVar8[uVar38].m_width <= uVar27) ||
                           (pvVar8[uVar38].m_height <= uVar18)) goto LAB_00205257;
                        uVar27 = pvVar8[uVar38].m_width * uVar18 + uVar27;
                        if (pvVar8[uVar38].m_values.m_size <= uVar27) goto LAB_00205238;
                        uVar27 = pvVar8[uVar38].m_values.m_p[uVar27].m_endpoint_index;
                        uVar25 = (ulong)uVar27;
                        if ((pbVar7->m_endpoint_cluster_etc_params).m_size <= uVar27) {
                          pcVar26 = 
                          "const T &basisu::vector<basisu::basisu_frontend::endpoint_cluster_etc_params>::operator[](size_t) const [T = basisu::basisu_frontend::endpoint_cluster_etc_params]"
                          ;
                          goto LAB_00205330;
                        }
                        peVar13 = (pbVar7->m_endpoint_cluster_etc_params).m_p;
                        uVar27 = peVar13[uVar25].m_inten_table[0];
                        local_b4 = *(anon_union_4_2_6eba8969_for_color_rgba_0 *)(peVar13 + uVar25);
                        local_a0 = uVar25;
                        etc_block::set_block_color5
                                  ((etc_block *)&local_c0,(color_rgba *)&local_b4.field_1,
                                   (color_rgba *)&local_b4);
                        if (7 < uVar27) {
                          __assert_fail("t < 8",
                                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_etc.h"
                                        ,0xc1,
                                        "void basisu::etc_block::set_inten_table(uint32_t, uint32_t)"
                                       );
                        }
                        cVar23 = (char)uVar27;
                        local_c0.m_bytes[3] = cVar23 << 2 | cVar23 << 5 | local_c0.m_bytes[3] & 3;
                        unpack_etc1((etc_block *)&local_c0,(color_rgba *)&local_88[0].field_1,false)
                        ;
                        if ((pbVar7->m_params).m_perceptual == false) {
                          uVar22 = 0;
                          uVar25 = 0;
                          do {
                            iVar29 = (uint)ppVar12[uVar24].m_pixels[0][uVar25].field_0.m_comps[0] -
                                     (uint)local_88[0].m_comps[uVar25 * 4];
                            iVar33 = (uint)ppVar12[uVar24].m_pixels[0][uVar25].field_0.m_comps[1] -
                                     (uint)local_88[0].m_comps[uVar25 * 4 + 1];
                            iVar34 = (uint)ppVar12[uVar24].m_pixels[0][uVar25].field_0.m_comps[2] -
                                     (uint)local_88[0].m_comps[uVar25 * 4 + 2];
                            uVar22 = (uint)(iVar34 * iVar34 + iVar33 * iVar33 + iVar29 * iVar29) +
                                     uVar22;
                            if (uVar21 < uVar22) break;
                            bVar41 = uVar25 < 0xf;
                            uVar25 = uVar25 + 1;
                          } while (bVar41);
                        }
                        else {
                          uVar22 = 0;
                          uVar25 = 0;
                          do {
                            iVar34 = (uint)ppVar12[uVar24].m_pixels[0][uVar25].field_0.m_comps[0] -
                                     (uint)local_88[0].m_comps[uVar25 * 4];
                            iVar29 = (uint)ppVar12[uVar24].m_pixels[0][uVar25].field_0.m_comps[2] -
                                     (uint)local_88[0].m_comps[uVar25 * 4 + 2];
                            iVar33 = iVar29 * 9 + iVar34 * 0x1b +
                                     ((uint)ppVar12[uVar24].m_pixels[0][uVar25].field_0.m_comps[1] -
                                     (uint)local_88[0].m_comps[uVar25 * 4 + 1]) * 0x5c;
                            lVar39 = (long)(iVar34 * 0x80 - iVar33);
                            lVar30 = (long)(iVar29 * 0x80 - iVar33);
                            uVar22 = (((uint)((int)((ulong)(lVar30 * lVar30) >> 7) * 3) >> 7) +
                                      (int)((ulong)((long)iVar33 * (long)iVar33) >> 7) +
                                     ((uint)((int)((ulong)(lVar39 * lVar39) >> 7) * 0x1a) >> 7)) +
                                     uVar22;
                            if (uVar21 < uVar22) break;
                            bVar41 = uVar25 < 0xf;
                            uVar25 = uVar25 + 1;
                          } while (bVar41);
                        }
                        this = local_c8;
                        if ((uVar22 <= uVar21) &&
                           ((uVar22 < local_b0 || ((uVar22 == local_b0 && (uVar40 < local_108))))))
                        {
                          local_108 = (uint)uVar40;
                          local_d0 = (int)local_a0;
                          local_b0 = uVar22;
                        }
                      }
                      uVar40 = uVar40 + 1;
                    } while (uVar40 != 3);
                    if (local_108 == 0xffffffff) {
                      local_134 = local_134 + 1;
                    }
                    else {
                      peVar32->m_endpoint_index = local_d0;
                      peVar32->m_endpoint_predictor = local_108;
                      local_130 = local_130 + 1;
                      local_10c = local_10c + 1;
                    }
                  }
                }
              }
              else {
                peVar32->m_endpoint_predictor = uVar27;
                local_130 = local_130 + 1;
              }
              if (peVar32->m_endpoint_predictor == 3) {
                local_88[0] = (anon_union_4_2_6eba8969_for_color_rgba_0)peVar32->m_endpoint_index;
                if (local_88 <
                    (anon_union_4_2_6eba8969_for_color_rgba_0 *)
                    (local_f8.m_p + (local_f8._8_8_ & 0xffffffff)) &&
                    (local_f8.m_p <= local_88 &&
                    (anon_union_4_2_6eba8969_for_color_rgba_0 *)local_f8.m_p !=
                    (anon_union_4_2_6eba8969_for_color_rgba_0 *)0x0)) goto LAB_002052af;
                if (local_f8.m_capacity <= local_f8.m_size) {
                  elemental_vector::increase_capacity
                            ((elemental_vector *)&local_f8,local_f8.m_size + 1,true,4,
                             (object_mover)0x0,false);
                }
                *(anon_union_4_2_6eba8969_for_color_rgba_0 *)
                 (local_f8.m_p + (local_f8._8_8_ & 0xffffffff)) = local_88[0];
                local_f8.m_size = local_f8.m_size + 1;
              }
              uVar37 = uVar37 + 1;
              local_cc = local_cc + 1;
            } while (uVar37 != uVar28);
          }
          uVar36 = uVar36 + 1;
          uVar19 = local_b8 + uVar28;
        } while (uVar36 != uVar16);
      }
      uVar38 = local_e0 + 1;
    } while (uVar38 < (this->m_slices).m_size);
  }
  fVar42 = 0.0;
  local_12c = 0.0;
  if ((this->m_slices).m_size != 0) {
    uVar16 = 0;
    uVar28 = 0;
    do {
      uVar19 = get_total_blocks(this,uVar16);
      uVar28 = uVar28 + uVar19;
      uVar16 = uVar16 + 1;
    } while (uVar16 < (this->m_slices).m_size);
    local_12c = (float)uVar28;
  }
  if ((this->m_slices).m_size != 0) {
    uVar16 = 0;
    uVar28 = 0;
    do {
      uVar19 = get_total_blocks(this,uVar16);
      uVar28 = uVar28 + uVar19;
      uVar16 = uVar16 + 1;
    } while (uVar16 < (this->m_slices).m_size);
    fVar42 = (float)uVar28;
  }
  if ((this->m_slices).m_size == 0) {
    fVar44 = 0.0;
  }
  else {
    uVar16 = 0;
    uVar28 = 0;
    do {
      uVar19 = get_total_blocks(this,uVar16);
      uVar28 = uVar28 + uVar19;
      uVar16 = uVar16 + 1;
    } while (uVar16 < (this->m_slices).m_size);
    fVar44 = (float)uVar28;
  }
  debug_printf("total_endpoint_pred_missed: %u (%3.2f%%) total_endpoint_pred_hit: %u (%3.2f%%), total_block_endpoints_remapped: %u (%3.2f%%)\n"
               ,(double)(((float)local_134 * 100.0) / local_12c),
               (double)(((float)local_130 * 100.0) / fVar42),
               (double)(((float)local_10c * 100.0) / fVar44),(ulong)local_134,(ulong)local_130,
               (ulong)local_10c);
  reoptimize_and_sort_endpoints_codebook(this,local_10c,&local_f8);
  sort_selector_codebook(this);
  check_for_valid_cr_blocks(this);
  interval_timer::get_elapsed_secs(&local_48);
  debug_printf("Elapsed time: %3.3f secs\n");
  if ((anon_union_4_2_6eba8969_for_color_rgba_0 *)local_f8.m_p !=
      (anon_union_4_2_6eba8969_for_color_rgba_0 *)0x0) {
    free(local_f8.m_p);
  }
  return;
}

Assistant:

void basisu_backend::create_encoder_blocks()
	{
		debug_printf("basisu_backend::create_encoder_blocks\n");

		interval_timer tm;
		tm.start();

		basisu_frontend& r = *m_pFront_end;
		const bool is_video = r.get_params().m_tex_type == basist::cBASISTexTypeVideoFrames;

		m_slice_encoder_blocks.resize(m_slices.size());

		uint32_t total_endpoint_pred_missed = 0, total_endpoint_pred_hits = 0, total_block_endpoints_remapped = 0;

		uint_vec all_endpoint_indices;
		all_endpoint_indices.reserve(get_total_blocks());

		for (uint32_t slice_index = 0; slice_index < m_slices.size(); slice_index++)
		{
			const int prev_frame_slice_index = is_video ? find_video_frame(slice_index, -1) : -1;
			const bool is_iframe = m_slices[slice_index].m_iframe;
			const uint32_t first_block_index = m_slices[slice_index].m_first_block_index;

			//const uint32_t width = m_slices[slice_index].m_width;
			//const uint32_t height = m_slices[slice_index].m_height;
			const uint32_t num_blocks_x = m_slices[slice_index].m_num_blocks_x;
			const uint32_t num_blocks_y = m_slices[slice_index].m_num_blocks_y;

			m_slice_encoder_blocks[slice_index].resize(num_blocks_x, num_blocks_y);

			for (uint32_t block_y = 0; block_y < num_blocks_y; block_y++)
			{
				for (uint32_t block_x = 0; block_x < num_blocks_x; block_x++)
				{
					const uint32_t block_index = first_block_index + block_x + block_y * num_blocks_x;

					encoder_block& m = m_slice_encoder_blocks[slice_index](block_x, block_y);

					m.m_endpoint_index = r.get_subblock_endpoint_cluster_index(block_index, 0);
					BASISU_BACKEND_VERIFY(r.get_subblock_endpoint_cluster_index(block_index, 0) == r.get_subblock_endpoint_cluster_index(block_index, 1));

					m.m_selector_index = r.get_block_selector_cluster_index(block_index);

					m.m_endpoint_predictor = basist::NO_ENDPOINT_PRED_INDEX;

					const uint32_t block_endpoint = m.m_endpoint_index;

					uint32_t best_endpoint_pred = UINT32_MAX;

					for (uint32_t endpoint_pred = 0; endpoint_pred < basist::NUM_ENDPOINT_PREDS; endpoint_pred++)
					{
						if ((is_video) && (endpoint_pred == basist::CR_ENDPOINT_PRED_INDEX))
						{
							if ((prev_frame_slice_index != -1) && (!is_iframe))
							{
								const uint32_t cur_endpoint = m_slice_encoder_blocks[slice_index](block_x, block_y).m_endpoint_index;
								const uint32_t cur_selector = m_slice_encoder_blocks[slice_index](block_x, block_y).m_selector_index;
								const uint32_t prev_endpoint = m_slice_encoder_blocks[prev_frame_slice_index](block_x, block_y).m_endpoint_index;
								const uint32_t prev_selector = m_slice_encoder_blocks[prev_frame_slice_index](block_x, block_y).m_selector_index;
								if ((cur_endpoint == prev_endpoint) && (cur_selector == prev_selector))
								{
									best_endpoint_pred = basist::CR_ENDPOINT_PRED_INDEX;
									m_slice_encoder_blocks[prev_frame_slice_index](block_x, block_y).m_is_cr_target = true;
								}
							}
						}
						else
						{
							int pred_block_x = block_x + g_endpoint_preds[endpoint_pred].m_dx;
							if ((pred_block_x < 0) || (pred_block_x >= (int)num_blocks_x))
								continue;

							int pred_block_y = block_y + g_endpoint_preds[endpoint_pred].m_dy;
							if ((pred_block_y < 0) || (pred_block_y >= (int)num_blocks_y))
								continue;

							uint32_t pred_endpoint = m_slice_encoder_blocks[slice_index](pred_block_x, pred_block_y).m_endpoint_index;

							if (pred_endpoint == block_endpoint)
							{
								if (endpoint_pred < best_endpoint_pred)
								{
									best_endpoint_pred = endpoint_pred;
								}
							}
						}

					} // endpoint_pred

					if (best_endpoint_pred != UINT32_MAX)
					{
						m.m_endpoint_predictor = best_endpoint_pred;

						total_endpoint_pred_hits++;
					}
					else if (m_params.m_endpoint_rdo_quality_thresh > 0.0f)
					{
						const pixel_block& src_pixels = r.get_source_pixel_block(block_index);

						etc_block etc_blk(r.get_output_block(block_index));

						uint64_t cur_err = etc_blk.evaluate_etc1_error(src_pixels.get_ptr(), r.get_params().m_perceptual);

						if (cur_err)
						{
							const uint64_t thresh_err = (uint64_t)(cur_err * maximum(1.0f, m_params.m_endpoint_rdo_quality_thresh));

							etc_block trial_etc_block(etc_blk);

							uint64_t best_err = UINT64_MAX;
							uint32_t best_endpoint_index = 0;

							best_endpoint_pred = UINT32_MAX;

							for (uint32_t endpoint_pred = 0; endpoint_pred < basist::NUM_ENDPOINT_PREDS; endpoint_pred++)
							{
								if ((is_video) && (endpoint_pred == basist::CR_ENDPOINT_PRED_INDEX))
									continue;

								int pred_block_x = block_x + g_endpoint_preds[endpoint_pred].m_dx;
								if ((pred_block_x < 0) || (pred_block_x >= (int)num_blocks_x))
									continue;

								int pred_block_y = block_y + g_endpoint_preds[endpoint_pred].m_dy;
								if ((pred_block_y < 0) || (pred_block_y >= (int)num_blocks_y))
									continue;

								uint32_t pred_endpoint_index = m_slice_encoder_blocks[slice_index](pred_block_x, pred_block_y).m_endpoint_index;

								uint32_t pred_inten = r.get_endpoint_cluster_inten_table(pred_endpoint_index, false);
								color_rgba pred_color = r.get_endpoint_cluster_unscaled_color(pred_endpoint_index, false);

								trial_etc_block.set_block_color5(pred_color, pred_color);
								trial_etc_block.set_inten_table(0, pred_inten);
								trial_etc_block.set_inten_table(1, pred_inten);

								color_rgba trial_colors[16];
								unpack_etc1(trial_etc_block, trial_colors);

								uint64_t trial_err = 0;
								if (r.get_params().m_perceptual)
								{
									for (uint32_t p = 0; p < 16; p++)
									{
										trial_err += color_distance(true, src_pixels.get_ptr()[p], trial_colors[p], false);
										if (trial_err > thresh_err)
											break;
									}
								}
								else
								{
									for (uint32_t p = 0; p < 16; p++)
									{
										trial_err += color_distance(false, src_pixels.get_ptr()[p], trial_colors[p], false);
										if (trial_err > thresh_err)
											break;
									}
								}

								if (trial_err <= thresh_err)
								{
									if ((trial_err < best_err) || ((trial_err == best_err) && (endpoint_pred < best_endpoint_pred)))
									{
										best_endpoint_pred = endpoint_pred;
										best_err = trial_err;
										best_endpoint_index = pred_endpoint_index;
									}
								}
							} // endpoint_pred

							if (best_endpoint_pred != UINT32_MAX)
							{
								m.m_endpoint_index = best_endpoint_index;
								m.m_endpoint_predictor = best_endpoint_pred;

								total_endpoint_pred_hits++;
								total_block_endpoints_remapped++;
							}
							else
							{
								total_endpoint_pred_missed++;
							}
						}
					}
					else
					{
						total_endpoint_pred_missed++;
					}

					if (m.m_endpoint_predictor == basist::NO_ENDPOINT_PRED_INDEX)
					{
						all_endpoint_indices.push_back(m.m_endpoint_index);
					}

				} // block_x

			} // block_y

		} // slice

		debug_printf("total_endpoint_pred_missed: %u (%3.2f%%) total_endpoint_pred_hit: %u (%3.2f%%), total_block_endpoints_remapped: %u (%3.2f%%)\n",
			total_endpoint_pred_missed, total_endpoint_pred_missed * 100.0f / get_total_blocks(),
			total_endpoint_pred_hits, total_endpoint_pred_hits * 100.0f / get_total_blocks(),
			total_block_endpoints_remapped, total_block_endpoints_remapped * 100.0f / get_total_blocks());

		reoptimize_and_sort_endpoints_codebook(total_block_endpoints_remapped, all_endpoint_indices);

		sort_selector_codebook();
		check_for_valid_cr_blocks();
		
		debug_printf("Elapsed time: %3.3f secs\n", tm.get_elapsed_secs());
	}